

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool __thiscall
CompareBoundaryRelation::WedgesCross
          (CompareBoundaryRelation *this,S2Point *a0,S2Point *ab1,S2Point *a2,S2Point *b0,
          S2Point *b2)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  long lVar6;
  bool bVar7;
  
  this->found_shared_vertex_ = true;
  dVar2 = b2->c_[0];
  dVar3 = a0->c_[0];
  if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
    lVar6 = 0;
    do {
      if (lVar6 == 0x10) goto LAB_00202870;
      dVar4 = *(double *)((long)b2->c_ + lVar6 + 8);
      pdVar1 = (double *)((long)a0->c_ + lVar6 + 8);
      lVar6 = lVar6 + 8;
    } while ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1)));
  }
  if ((dVar2 == a2->c_[0]) && (!NAN(dVar2) && !NAN(a2->c_[0]))) {
    lVar6 = 0;
    do {
      if (lVar6 == 0x10) goto LAB_00202870;
      dVar4 = *(double *)((long)b2->c_ + lVar6 + 8);
      pdVar1 = (double *)((long)a2->c_ + lVar6 + 8);
      lVar6 = lVar6 + 8;
    } while ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1)));
  }
  bVar5 = s2pred::OrderedCCW(a0,a2,b2,ab1);
  goto LAB_0020289e;
LAB_00202870:
  if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
    lVar6 = 0;
    do {
      bVar7 = lVar6 == 0x10;
      if (bVar7) goto LAB_0020289a;
      dVar2 = *(double *)((long)b2->c_ + lVar6 + 8);
      pdVar1 = (double *)((long)a0->c_ + lVar6 + 8);
      lVar6 = lVar6 + 8;
    } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
  }
  bVar7 = false;
LAB_0020289a:
  bVar5 = bVar7 ^ this->reverse_b_ ^ 1;
LAB_0020289e:
  if (bVar5 == 0) {
    this->excludes_edge_ = true;
  }
  else {
    this->contains_edge_ = true;
  }
  return (bool)(this->excludes_edge_ & this->contains_edge_);
}

Assistant:

bool WedgesCross(const S2Point& a0, const S2Point& ab1, const S2Point& a2,
                   const S2Point& b0, const S2Point& b2) override {
    // Because we don't care about the interior of B, only its boundary, it is
    // sufficient to check whether A contains the semiwedge (ab1, b2).
    found_shared_vertex_ = true;
    if (WedgeContainsSemiwedge(a0, ab1, a2, b2, reverse_b_)) {
      contains_edge_ = true;
    } else {
      excludes_edge_ = true;
    }
    return contains_edge_ & excludes_edge_;
  }